

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_iterator_suite.cpp
# Opt level: O0

void operator_suite::addition_assignment(void)

{
  basic_iterator<int> __last;
  basic_iterator<int> __last_00;
  basic_iterator<int> __last_01;
  basic_iterator<int> __last_02;
  basic_iterator<int> __last_03;
  basic_iterator<int> __last_04;
  basic_iterator<int> __last_05;
  basic_iterator<int> __last_06;
  basic_iterator<int> __last_07;
  basic_iterator<int> __last_08;
  basic_iterator<int> __last_09;
  basic_iterator<int> __last_10;
  basic_iterator<int> __last_11;
  basic_iterator<int> __last_12;
  basic_iterator<int> __last_13;
  initializer_list<int> input;
  iterator iVar1;
  undefined4 local_5f4;
  view_pointer local_5f0;
  view_pointer local_5e8;
  iterator local_5e0;
  difference_type local_5d0 [2];
  iterator local_5c0;
  undefined4 local_5ac;
  view_pointer local_5a8;
  view_pointer local_5a0;
  iterator local_598;
  difference_type local_588 [2];
  iterator local_578;
  undefined4 local_564;
  view_pointer local_560;
  view_pointer local_558;
  iterator local_550;
  difference_type local_540 [2];
  iterator local_530;
  undefined4 local_51c;
  view_pointer local_518;
  view_pointer local_510;
  iterator local_508;
  difference_type local_4f8 [2];
  undefined1 local_4e8 [8];
  iterator where_4;
  difference_type local_4b0 [2];
  iterator local_4a0;
  undefined4 local_48c;
  view_pointer local_488;
  view_pointer local_480;
  iterator local_478;
  difference_type local_468 [2];
  iterator local_458;
  undefined4 local_444;
  view_pointer local_440;
  view_pointer local_438;
  iterator local_430;
  difference_type local_420 [2];
  iterator local_410;
  undefined4 local_3fc;
  view_pointer local_3f8;
  view_pointer local_3f0;
  iterator local_3e8;
  difference_type local_3d8 [2];
  undefined1 local_3c8 [8];
  iterator where_3;
  difference_type local_390 [2];
  iterator local_380;
  undefined4 local_36c;
  view_pointer local_368;
  view_pointer local_360;
  iterator local_358;
  difference_type local_348 [2];
  iterator local_338;
  undefined4 local_324;
  view_pointer local_320;
  view_pointer local_318;
  iterator local_310;
  difference_type local_300 [2];
  iterator local_2f0;
  undefined4 local_2dc;
  view_pointer local_2d8;
  view_pointer local_2d0;
  iterator local_2c8;
  difference_type local_2b8 [2];
  undefined1 local_2a8 [8];
  iterator where_2;
  difference_type local_270 [2];
  iterator local_260;
  undefined4 local_24c;
  view_pointer local_248;
  view_pointer local_240;
  iterator local_238;
  difference_type local_228 [2];
  iterator local_218;
  undefined4 local_204;
  view_pointer local_200;
  view_pointer local_1f8;
  iterator local_1f0;
  difference_type local_1e0 [2];
  iterator local_1d0;
  undefined4 local_1bc;
  view_pointer local_1b8;
  view_pointer local_1b0;
  iterator local_1a8;
  difference_type local_198 [2];
  undefined1 local_188 [8];
  iterator where_1;
  difference_type local_150 [2];
  iterator local_140;
  undefined4 local_12c;
  view_pointer local_128;
  view_pointer local_120;
  iterator local_118;
  difference_type local_108 [2];
  iterator local_f8;
  undefined4 local_e4;
  view_pointer local_e0;
  view_pointer local_d8;
  iterator local_d0;
  difference_type local_c0 [2];
  iterator local_b0;
  undefined4 local_9c;
  view_pointer local_98;
  view_pointer local_90;
  iterator local_88;
  difference_type local_78 [2];
  undefined1 local_68 [8];
  iterator where;
  undefined1 local_38 [8];
  circular_view<int,_18446744073709551615UL> span;
  int array [4];
  
  memset(&span.member.next,0,0x10);
  vista::circular_view<int,_18446744073709551615UL>::circular_view<4UL,_0>
            ((circular_view<int,_18446744073709551615UL> *)local_38,
             (value_type (*) [4])&span.member.next);
  where.current._0_4_ = 0xb;
  where.current._4_4_ = 0x16;
  input._M_len = 4;
  input._M_array = (iterator)&where.current;
  vista::circular_view<int,_18446744073709551615UL>::operator=
            ((circular_view<int,_18446744073709551615UL> *)local_38,input);
  _local_68 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_68,0);
  local_88 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_98 = (view_pointer)local_68;
  local_90 = where.parent;
  local_78[0] = std::distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                          (local_88,_local_68);
  local_9c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x33b,"void operator_suite::addition_assignment()",local_78,&local_9c);
  local_b0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_68 = (undefined1  [8])local_b0.parent;
  where.parent = (view_pointer)local_b0.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_68,1);
  local_d0 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_e0 = (view_pointer)local_68;
  local_d8 = where.parent;
  __last_13.current = (size_type)where.parent;
  __last_13.parent = (view_pointer)local_68;
  local_c0[0] = std::distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                          (local_d0,__last_13);
  local_e4 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x33e,"void operator_suite::addition_assignment()",local_c0,&local_e4);
  local_f8 = vista::circular_view<int,_18446744073709551615UL>::begin
                       ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_68 = (undefined1  [8])local_f8.parent;
  where.parent = (view_pointer)local_f8.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_68,2);
  local_118 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_128 = (view_pointer)local_68;
  local_120 = where.parent;
  __last_12.current = (size_type)where.parent;
  __last_12.parent = (view_pointer)local_68;
  local_108[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_118,__last_12);
  local_12c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x341,"void operator_suite::addition_assignment()",local_108,&local_12c);
  local_140 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_68 = (undefined1  [8])local_140.parent;
  where.parent = (view_pointer)local_140.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_68,3);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  __last_11.current = (size_type)where.parent;
  __last_11.parent = (view_pointer)local_68;
  local_150[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (iVar1,__last_11);
  where_1.current._4_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x344,"void operator_suite::addition_assignment()",local_150,
             (undefined1 *)((long)&where_1.current + 4));
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x37);
  _local_188 = vista::circular_view<int,_18446744073709551615UL>::begin
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_188,0);
  local_1a8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_1b8 = (view_pointer)local_188;
  local_1b0 = where_1.parent;
  local_198[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_1a8,_local_188);
  local_1bc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x34a,"void operator_suite::addition_assignment()",local_198,&local_1bc);
  local_1d0 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_188 = (undefined1  [8])local_1d0.parent;
  where_1.parent = (view_pointer)local_1d0.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_188,1);
  local_1f0 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_200 = (view_pointer)local_188;
  local_1f8 = where_1.parent;
  __last_10.current = (size_type)where_1.parent;
  __last_10.parent = (view_pointer)local_188;
  local_1e0[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_1f0,__last_10);
  local_204 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x34d,"void operator_suite::addition_assignment()",local_1e0,&local_204);
  local_218 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_188 = (undefined1  [8])local_218.parent;
  where_1.parent = (view_pointer)local_218.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_188,2);
  local_238 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_248 = (view_pointer)local_188;
  local_240 = where_1.parent;
  __last_09.current = (size_type)where_1.parent;
  __last_09.parent = (view_pointer)local_188;
  local_228[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_238,__last_09);
  local_24c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x350,"void operator_suite::addition_assignment()",local_228,&local_24c);
  local_260 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_188 = (undefined1  [8])local_260.parent;
  where_1.parent = (view_pointer)local_260.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_188,3);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  __last_08.current = (size_type)where_1.parent;
  __last_08.parent = (view_pointer)local_188;
  local_270[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (iVar1,__last_08);
  where_2.current._4_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x353,"void operator_suite::addition_assignment()",local_270,
             (undefined1 *)((long)&where_2.current + 4));
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x42);
  _local_2a8 = vista::circular_view<int,_18446744073709551615UL>::begin
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_2a8,0);
  local_2c8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_2d8 = (view_pointer)local_2a8;
  local_2d0 = where_2.parent;
  local_2b8[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_2c8,_local_2a8);
  local_2dc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x359,"void operator_suite::addition_assignment()",local_2b8,&local_2dc);
  local_2f0 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_2a8 = (undefined1  [8])local_2f0.parent;
  where_2.parent = (view_pointer)local_2f0.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_2a8,1);
  local_310 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_320 = (view_pointer)local_2a8;
  local_318 = where_2.parent;
  __last_07.current = (size_type)where_2.parent;
  __last_07.parent = (view_pointer)local_2a8;
  local_300[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_310,__last_07);
  local_324 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x35c,"void operator_suite::addition_assignment()",local_300,&local_324);
  local_338 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_2a8 = (undefined1  [8])local_338.parent;
  where_2.parent = (view_pointer)local_338.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_2a8,2);
  local_358 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_368 = (view_pointer)local_2a8;
  local_360 = where_2.parent;
  __last_06.current = (size_type)where_2.parent;
  __last_06.parent = (view_pointer)local_2a8;
  local_348[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_358,__last_06);
  local_36c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x35f,"void operator_suite::addition_assignment()",local_348,&local_36c);
  local_380 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_2a8 = (undefined1  [8])local_380.parent;
  where_2.parent = (view_pointer)local_380.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_2a8,3);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  __last_05.current = (size_type)where_2.parent;
  __last_05.parent = (view_pointer)local_2a8;
  local_390[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (iVar1,__last_05);
  where_3.current._4_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x362,"void operator_suite::addition_assignment()",local_390,
             (undefined1 *)((long)&where_3.current + 4));
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x4d);
  _local_3c8 = vista::circular_view<int,_18446744073709551615UL>::begin
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_3c8,0);
  local_3e8 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_3f8 = (view_pointer)local_3c8;
  local_3f0 = where_3.parent;
  local_3d8[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_3e8,_local_3c8);
  local_3fc = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x368,"void operator_suite::addition_assignment()",local_3d8,&local_3fc);
  local_410 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_3c8 = (undefined1  [8])local_410.parent;
  where_3.parent = (view_pointer)local_410.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_3c8,1);
  local_430 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_440 = (view_pointer)local_3c8;
  local_438 = where_3.parent;
  __last_04.current = (size_type)where_3.parent;
  __last_04.parent = (view_pointer)local_3c8;
  local_420[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_430,__last_04);
  local_444 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x36b,"void operator_suite::addition_assignment()",local_420,&local_444);
  local_458 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_3c8 = (undefined1  [8])local_458.parent;
  where_3.parent = (view_pointer)local_458.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_3c8,2);
  local_478 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_488 = (view_pointer)local_3c8;
  local_480 = where_3.parent;
  __last_03.current = (size_type)where_3.parent;
  __last_03.parent = (view_pointer)local_3c8;
  local_468[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_478,__last_03);
  local_48c = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x36e,"void operator_suite::addition_assignment()",local_468,&local_48c);
  local_4a0 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_3c8 = (undefined1  [8])local_4a0.parent;
  where_3.parent = (view_pointer)local_4a0.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_3c8,3);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin
                    ((circular_view<int,_18446744073709551615UL> *)local_38);
  __last_02.current = (size_type)where_3.parent;
  __last_02.parent = (view_pointer)local_3c8;
  local_4b0[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (iVar1,__last_02);
  where_4.current._4_4_ = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x371,"void operator_suite::addition_assignment()",local_4b0,
             (undefined1 *)((long)&where_4.current + 4));
  vista::circular_view<int,_18446744073709551615UL>::push_back
            ((circular_view<int,_18446744073709551615UL> *)local_38,0x58);
  _local_4e8 = vista::circular_view<int,_18446744073709551615UL>::begin
                         ((circular_view<int,_18446744073709551615UL> *)local_38);
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_4e8,0);
  local_508 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_518 = (view_pointer)local_4e8;
  local_510 = where_4.parent;
  local_4f8[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_508,_local_4e8);
  local_51c = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x377,"void operator_suite::addition_assignment()",local_4f8,&local_51c);
  local_530 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4e8 = (undefined1  [8])local_530.parent;
  where_4.parent = (view_pointer)local_530.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_4e8,1);
  local_550 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_560 = (view_pointer)local_4e8;
  local_558 = where_4.parent;
  __last_01.current = (size_type)where_4.parent;
  __last_01.parent = (view_pointer)local_4e8;
  local_540[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_550,__last_01);
  local_564 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x37a,"void operator_suite::addition_assignment()",local_540,&local_564);
  local_578 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4e8 = (undefined1  [8])local_578.parent;
  where_4.parent = (view_pointer)local_578.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_4e8,2);
  local_598 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_5a8 = (view_pointer)local_4e8;
  local_5a0 = where_4.parent;
  __last_00.current = (size_type)where_4.parent;
  __last_00.parent = (view_pointer)local_4e8;
  local_588[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_598,__last_00);
  local_5ac = 2;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","2",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x37d,"void operator_suite::addition_assignment()",local_588,&local_5ac);
  local_5c0 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_4e8 = (undefined1  [8])local_5c0.parent;
  where_4.parent = (view_pointer)local_5c0.current;
  vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator+=
            ((basic_iterator<int> *)local_4e8,3);
  local_5e0 = vista::circular_view<int,_18446744073709551615UL>::begin
                        ((circular_view<int,_18446744073709551615UL> *)local_38);
  local_5f0 = (view_pointer)local_4e8;
  local_5e8 = where_4.parent;
  __last.current = (size_type)where_4.parent;
  __last.parent = (view_pointer)local_4e8;
  local_5d0[0] = std::
                 distance<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>>
                           (local_5e0,__last);
  local_5f4 = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::distance(span.begin(), where)","3",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_iterator_suite.cpp"
             ,0x380,"void operator_suite::addition_assignment()",local_5d0,&local_5f4);
  return;
}

Assistant:

void addition_assignment()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(55);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(66);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(77);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
    span.push_back(88);
    {
        auto where = span.begin();
        where += 0;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 0);
        where = span.begin();
        where += 1;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 1);
        where = span.begin();
        where += 2;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 2);
        where = span.begin();
        where += 3;
        BOOST_TEST_EQ(std::distance(span.begin(), where), 3);
    }
}